

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O2

int32 mllr_read_regmat(char *regmatfile,float32 ****A,float32 ***B,float32 ***H,int32 *nclass,
                      int32 ceplen)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  float32 ***inptr;
  float32 **ppfVar4;
  long lVar5;
  long lVar6;
  size_t d2;
  ulong uVar7;
  float32 **tmpptr;
  ulong uVar8;
  int32 n;
  char *local_90;
  float32 **local_88;
  float32 **local_80;
  float32 ***local_78;
  uint local_6c;
  float32 ***local_68;
  int32 local_5c;
  float32 ****local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  int32 *local_38;
  
  local_6c = ceplen;
  __stream = fopen(regmatfile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
            ,0x80,"fopen(%s,r) failed\n",regmatfile);
    return -1;
  }
  local_90 = regmatfile;
  local_58 = A;
  local_38 = nclass;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
          ,0x84,"Reading MLLR transformation file %s\n",regmatfile);
  iVar3 = __isoc99_fscanf(__stream,"%d",&n);
  iVar1 = n;
  local_68 = H;
  if (0 < n && iVar3 == 1) {
    inptr = (float32 ***)0x0;
    iVar3 = __isoc99_fscanf(__stream,"%d",&n);
    uVar2 = local_6c;
    if (iVar3 == 1) {
      ppfVar4 = (float32 **)0x0;
      tmpptr = (float32 **)0x0;
      if (n == 1) {
        local_5c = iVar1;
        uVar7 = (ulong)(uint)iVar1;
        d2 = (size_t)(int)local_6c;
        local_78 = B;
        inptr = (float32 ***)
                __ckd_calloc_3d__(uVar7,d2,d2,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                  ,0x93);
        local_80 = (float32 **)
                   __ckd_calloc_2d__(uVar7,d2,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                     ,0x94);
        ppfVar4 = (float32 **)
                  __ckd_calloc_2d__(uVar7,d2,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                    ,0x95);
        local_40 = 0;
        if (0 < (int)uVar2) {
          local_40 = (ulong)uVar2;
        }
        local_48 = local_40 * 4 + 4;
        uVar8 = 0;
        while( true ) {
          if (uVar8 == uVar7) {
            *local_58 = inptr;
            *local_78 = local_80;
            *local_68 = ppfVar4;
            if (local_38 != (int32 *)0x0) {
              *local_38 = local_5c;
            }
            fclose(__stream);
            return 0;
          }
          local_88 = ppfVar4;
          local_50 = uVar7;
          iVar3 = __isoc99_fscanf(__stream,"%d",&n);
          ppfVar4 = local_80;
          tmpptr = local_88;
          B = local_78;
          if ((iVar3 != 1) || (n != local_6c)) break;
          for (uVar7 = 0; lVar5 = local_48, uVar7 != local_40; uVar7 = uVar7 + 1) {
            lVar5 = 0;
            while ((ulong)uVar2 * 4 + 4 != lVar5 + 4) {
              iVar3 = __isoc99_fscanf(__stream,"%f ",lVar5 + (long)inptr[uVar8][uVar7]);
              lVar5 = lVar5 + 4;
              ppfVar4 = local_80;
              tmpptr = local_88;
              B = local_78;
              if (iVar3 != 1) goto LAB_0011594c;
            }
          }
          lVar6 = 0;
          while (lVar5 != lVar6 + 4) {
            iVar3 = __isoc99_fscanf(__stream,"%f ",lVar6 + (long)local_80[uVar8]);
            lVar6 = lVar6 + 4;
            ppfVar4 = local_80;
            tmpptr = local_88;
            B = local_78;
            if (iVar3 != 1) goto LAB_0011594c;
          }
          lVar6 = 0;
          while (lVar5 != lVar6 + 4) {
            iVar3 = __isoc99_fscanf(__stream,"%f ",lVar6 + (long)local_88[uVar8]);
            lVar6 = lVar6 + 4;
            ppfVar4 = local_80;
            tmpptr = local_88;
            B = local_78;
            if (iVar3 != 1) goto LAB_0011594c;
          }
          uVar8 = uVar8 + 1;
          ppfVar4 = local_88;
          uVar7 = local_50;
        }
      }
      goto LAB_0011594c;
    }
  }
  inptr = (float32 ***)0x0;
  ppfVar4 = (float32 **)0x0;
  tmpptr = (float32 **)0x0;
LAB_0011594c:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
          ,0xb7,"Error reading MLLR file %s\n",local_90);
  ckd_free_3d(inptr);
  ckd_free_2d(ppfVar4);
  ckd_free_2d(tmpptr);
  fclose(__stream);
  *local_58 = (float32 ***)0x0;
  *B = (float32 **)0x0;
  *local_68 = (float32 **)0x0;
  return -1;
}

Assistant:

int32
mllr_read_regmat(const char *regmatfile,
                 float32 **** A,
                 float32 *** B,
		 float32 *** H,
		 int32 * nclass, int32 ceplen)
{
    int32 i, j, k, n, lnclass;
    FILE *fp;
    float32 ***lA, **lB, **lH;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR("fopen(%s,r) failed\n", regmatfile);
        return -1;
    }
    else
        E_INFO("Reading MLLR transformation file %s\n", regmatfile);

    lA = NULL;
    lB = NULL;
    lH = NULL;

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1))
        goto readerror;
    lnclass = n;

    /* The number of stream must be 1 for now (archan@cs.cmu.edu 24-Jul-2004) */
    if ((fscanf(fp, "%d", &n) != 1) || (n != 1))
        goto readerror;

    lA = (float32 ***) ckd_calloc_3d(lnclass, ceplen, ceplen,
                                     sizeof(float32));
    lB = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));
    lH = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));

    for (i = 0; i < lnclass; i++) {
        /* We definitely do not allow different classes to have different
           feature vector lengths! (that would be silly) */
        if ((fscanf(fp, "%d", &n) != 1) || (ceplen != n))
            goto readerror;
        for (j = 0; j < ceplen; j++) {
            for (k = 0; k < ceplen; ++k) {
                if (fscanf(fp, "%f ", &lA[i][j][k]) != 1)
                    goto readerror;
            }
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lB[i][j]) != 1)
                goto readerror;
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lH[i][j]) != 1)
                goto readerror;
        }
    }

    *A = lA;
    *B = lB;
    *H = lH;
    if (nclass)
        *nclass = lnclass;

    fclose(fp);

    return 0;

  readerror:
    E_ERROR("Error reading MLLR file %s\n", regmatfile);
    ckd_free_3d((void ***) lA);
    ckd_free_2d((void **) lB);
    ckd_free_2d((void **) lH);

    fclose(fp);

    *A = NULL;
    *B = NULL;
    *H = NULL;

    return -1;
}